

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O0

void advance_eg_channel(FM_OPN *OPN,FM_SLOT *SLOT)

{
  UINT8 UVar1;
  int local_1c;
  FM_SLOT *pFStack_18;
  uint i;
  FM_SLOT *SLOT_local;
  FM_OPN *OPN_local;
  
  local_1c = 4;
  pFStack_18 = SLOT;
  do {
    switch(pFStack_18->state) {
    case '\x01':
      if ((OPN->eg_cnt & (1 << (pFStack_18->eg_sh_rr & 0x1f)) - 1U) == 0) {
        if ((pFStack_18->ssg & 8) == 0) {
          pFStack_18->volume =
               (uint)""[(uint)pFStack_18->eg_sel_rr +
                        (OPN->eg_cnt >> (pFStack_18->eg_sh_rr & 0x1f) & 7)] + pFStack_18->volume;
          if (0x3fe < pFStack_18->volume) {
            pFStack_18->volume = 0x3ff;
            pFStack_18->state = '\0';
          }
        }
        else {
          if (pFStack_18->volume < 0x200) {
            pFStack_18->volume =
                 (uint)""[(uint)pFStack_18->eg_sel_rr +
                          (OPN->eg_cnt >> (pFStack_18->eg_sh_rr & 0x1f) & 7)] * 4 +
                 pFStack_18->volume;
          }
          if (0x1ff < pFStack_18->volume) {
            pFStack_18->volume = 0x3ff;
            pFStack_18->state = '\0';
          }
        }
        pFStack_18->vol_out = pFStack_18->volume + pFStack_18->tl;
      }
      break;
    case '\x02':
      if ((OPN->eg_cnt & (1 << (pFStack_18->eg_sh_d2r & 0x1f)) - 1U) == 0) {
        if ((pFStack_18->ssg & 8) == 0) {
          pFStack_18->volume =
               (uint)""[(uint)pFStack_18->eg_sel_d2r +
                        (OPN->eg_cnt >> (pFStack_18->eg_sh_d2r & 0x1f) & 7)] + pFStack_18->volume;
          if (0x3fe < pFStack_18->volume) {
            pFStack_18->volume = 0x3ff;
          }
          pFStack_18->vol_out = pFStack_18->volume + pFStack_18->tl;
        }
        else if (pFStack_18->volume < 0x200) {
          pFStack_18->volume =
               (uint)""[(uint)pFStack_18->eg_sel_d2r +
                        (OPN->eg_cnt >> (pFStack_18->eg_sh_d2r & 0x1f) & 7)] * 4 +
               pFStack_18->volume;
          if (pFStack_18->ssgn == (pFStack_18->ssg & 4)) {
            pFStack_18->vol_out = pFStack_18->volume + pFStack_18->tl;
          }
          else {
            pFStack_18->vol_out = (0x200U - pFStack_18->volume & 0x3ff) + pFStack_18->tl;
          }
        }
      }
      break;
    case '\x03':
      if ((OPN->eg_cnt & (1 << (pFStack_18->eg_sh_d1r & 0x1f)) - 1U) == 0) {
        if ((pFStack_18->ssg & 8) == 0) {
          pFStack_18->volume =
               (uint)""[(uint)pFStack_18->eg_sel_d1r +
                        (OPN->eg_cnt >> (pFStack_18->eg_sh_d1r & 0x1f) & 7)] + pFStack_18->volume;
          pFStack_18->vol_out = pFStack_18->volume + pFStack_18->tl;
        }
        else if (pFStack_18->volume < 0x200) {
          pFStack_18->volume =
               (uint)""[(uint)pFStack_18->eg_sel_d1r +
                        (OPN->eg_cnt >> (pFStack_18->eg_sh_d1r & 0x1f) & 7)] * 4 +
               pFStack_18->volume;
          if (pFStack_18->ssgn == (pFStack_18->ssg & 4)) {
            pFStack_18->vol_out = pFStack_18->volume + pFStack_18->tl;
          }
          else {
            pFStack_18->vol_out = (0x200U - pFStack_18->volume & 0x3ff) + pFStack_18->tl;
          }
        }
        if ((int)pFStack_18->sl <= pFStack_18->volume) {
          pFStack_18->state = '\x02';
        }
      }
      break;
    case '\x04':
      if ((OPN->eg_cnt & (1 << (pFStack_18->eg_sh_ar & 0x1f)) - 1U) == 0) {
        pFStack_18->volume =
             ((int)((pFStack_18->volume ^ 0xffffffffU) *
                   (uint)""[(uint)pFStack_18->eg_sel_ar +
                            (OPN->eg_cnt >> (pFStack_18->eg_sh_ar & 0x1f) & 7)]) >> 4) +
             pFStack_18->volume;
        if (pFStack_18->volume < 1) {
          pFStack_18->volume = 0;
          UVar1 = '\x03';
          if (pFStack_18->sl == 0) {
            UVar1 = '\x02';
          }
          pFStack_18->state = UVar1;
        }
        if (((pFStack_18->ssg & 8) == 0) || (pFStack_18->ssgn == (pFStack_18->ssg & 4))) {
          pFStack_18->vol_out = pFStack_18->volume + pFStack_18->tl;
        }
        else {
          pFStack_18->vol_out = (0x200U - pFStack_18->volume & 0x3ff) + pFStack_18->tl;
        }
      }
    }
    pFStack_18 = pFStack_18 + 1;
    local_1c = local_1c + -1;
  } while (local_1c != 0);
  return;
}

Assistant:

INLINE void advance_eg_channel(FM_OPN *OPN, FM_SLOT *SLOT)
{
	/* unsigned int out; */
	unsigned int i = 4; /* four operators per channel */

	do
	{
		switch(SLOT->state)
		{
			case EG_ATT:    /* attack phase */
			if (!(OPN->eg_cnt & ((1<<SLOT->eg_sh_ar)-1)))
			{
				/* update attenuation level */
				SLOT->volume += (~SLOT->volume * (eg_inc[SLOT->eg_sel_ar + ((OPN->eg_cnt>>SLOT->eg_sh_ar)&7)]))>>4;

				/* check phase transition*/
				if (SLOT->volume <= MIN_ATT_INDEX)
				{
					SLOT->volume = MIN_ATT_INDEX;
					SLOT->state = (SLOT->sl == MIN_ATT_INDEX) ? EG_SUS : EG_DEC; /* special case where SL=0 */
				}

				/* recalculate EG output */
				if ((SLOT->ssg&0x08) && (SLOT->ssgn ^ (SLOT->ssg&0x04)))  /* SSG-EG Output Inversion */
				SLOT->vol_out = ((UINT32)(0x200 - SLOT->volume) & MAX_ATT_INDEX) + SLOT->tl;
				else
					SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
			}
			break;

			case EG_DEC:  /* decay phase */
			if (!(OPN->eg_cnt & ((1<<SLOT->eg_sh_d1r)-1)))
			{
				/* SSG EG type */
				if (SLOT->ssg&0x08)
				{
					/* update attenuation level */
					if (SLOT->volume < 0x200)
				{
					SLOT->volume += 4 * eg_inc[SLOT->eg_sel_d1r + ((OPN->eg_cnt>>SLOT->eg_sh_d1r)&7)];

					/* recalculate EG output */
					if (SLOT->ssgn ^ (SLOT->ssg&0x04))   /* SSG-EG Output Inversion */
						SLOT->vol_out = ((UINT32)(0x200 - SLOT->volume) & MAX_ATT_INDEX) + SLOT->tl;
					else
						SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
				}

				}
				else
				{
				/* update attenuation level */
				SLOT->volume += eg_inc[SLOT->eg_sel_d1r + ((OPN->eg_cnt>>SLOT->eg_sh_d1r)&7)];

				/* recalculate EG output */
				SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
				}

				/* check phase transition*/
				if (SLOT->volume >= (INT32)(SLOT->sl))
					SLOT->state = EG_SUS;
			}
			break;

			case EG_SUS:  /* sustain phase */
			if (!(OPN->eg_cnt & ((1<<SLOT->eg_sh_d2r)-1)))
			{
				/* SSG EG type */
				if (SLOT->ssg&0x08)
				{
				/* update attenuation level */
				if (SLOT->volume < 0x200)
				{
					SLOT->volume += 4 * eg_inc[SLOT->eg_sel_d2r + ((OPN->eg_cnt>>SLOT->eg_sh_d2r)&7)];

					/* recalculate EG output */
					if (SLOT->ssgn ^ (SLOT->ssg&0x04))   /* SSG-EG Output Inversion */
						SLOT->vol_out = ((UINT32)(0x200 - SLOT->volume) & MAX_ATT_INDEX) + SLOT->tl;
					else
						SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
				}
				}
				else
				{
					/* update attenuation level */
					SLOT->volume += eg_inc[SLOT->eg_sel_d2r + ((OPN->eg_cnt>>SLOT->eg_sh_d2r)&7)];

					/* check phase transition*/
					if ( SLOT->volume >= MAX_ATT_INDEX )
						SLOT->volume = MAX_ATT_INDEX;
					/* do not change SLOT->state (verified on real chip) */

					/* recalculate EG output */
					SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
				}
			}
			break;

			case EG_REL:  /* release phase */
			if (!(OPN->eg_cnt & ((1<<SLOT->eg_sh_rr)-1)))
			{
				/* SSG EG type */
				if (SLOT->ssg&0x08)
				{
					/* update attenuation level */
					if (SLOT->volume < 0x200)
						SLOT->volume += 4 * eg_inc[SLOT->eg_sel_rr + ((OPN->eg_cnt>>SLOT->eg_sh_rr)&7)];
				/* check phase transition */
				if (SLOT->volume >= 0x200)
				{
					SLOT->volume = MAX_ATT_INDEX;
					SLOT->state = EG_OFF;
				}
				}
				else
				{
					/* update attenuation level */
					SLOT->volume += eg_inc[SLOT->eg_sel_rr + ((OPN->eg_cnt>>SLOT->eg_sh_rr)&7)];

					/* check phase transition*/
					if (SLOT->volume >= MAX_ATT_INDEX)
					{
						SLOT->volume = MAX_ATT_INDEX;
						SLOT->state = EG_OFF;
					}
				}

				/* recalculate EG output */
				SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;

			}
			break;
		}

		/* Valley Bell: These few lines are missing in Genesis Plus GX' ym2612 core file.
			Disabling them fixes the SSG-EG.
			Additional Note: Asterix and the Great Rescue: Level 1 sounds "better" with these lines,
			but less accurate. */
		#if 0
		out = ((UINT32)SLOT->volume);

		/* negate output (changes come from alternate bit, init comes from attack bit) */
		if ((SLOT->ssg&0x08) && (SLOT->ssgn&2) && (SLOT->state > EG_REL))
			out ^= MAX_ATT_INDEX;

		/* we need to store the result here because we are going to change ssgn
			in next instruction */
		SLOT->vol_out = out + SLOT->tl;
		#endif

		SLOT++;
		i--;
	} while (i);

}